

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.h
# Opt level: O1

Vector3<double> * __thiscall
S2::GetSurfaceIntegral<Vector3<double>>
          (Vector3<double> *__return_storage_ptr__,S2 *this,S2PointLoopSpan loop,
          _func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *f_tri)

{
  double *pdVar1;
  FloatType FVar2;
  bool bVar3;
  reference pVVar4;
  reference pVVar5;
  code *pcVar6;
  long lVar7;
  int i;
  pointer pVVar8;
  double dVar9;
  S2Point old_origin;
  double local_f0;
  double local_e8;
  double local_e0;
  Vector3<double> local_d8;
  Vector3<double> *local_b8;
  Vector3_d local_b0;
  S2PointLoopSpan local_98;
  double local_88;
  VType VStack_80;
  VType local_78;
  code *local_70;
  int local_64;
  double local_60;
  pointer local_58;
  S2LogMessage local_50;
  S2LogMessage local_40;
  
  pcVar6 = (code *)loop.super_S2PointSpan.len_;
  local_98.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  if ((pointer)0x2 < local_98.super_S2PointSpan.len_) {
    local_98.super_S2PointSpan.ptr_ = (pointer)this;
    pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
    local_d8.c_[2] = pVVar4->c_[2];
    local_d8.c_[0] = pVVar4->c_[0];
    local_d8.c_[1] = pVVar4->c_[1];
    local_e0 = __return_storage_ptr__->c_[0];
    if ((pointer)0x2 < local_98.super_S2PointSpan.len_) {
      local_f0 = __return_storage_ptr__->c_[1];
      local_e8 = __return_storage_ptr__->c_[2];
      i = 1;
      pVVar8 = (pointer)0x2;
      local_b8 = __return_storage_ptr__;
      local_70 = pcVar6;
      do {
        if (i == 1) {
          bVar3 = false;
        }
        else {
          pVVar4 = S2PointLoopSpan::operator[](&local_98,i);
          FVar2 = Vector3<double>::Angle(&local_d8,pVVar4);
          bVar3 = 3.141582653589793 <= FVar2;
        }
        if (bVar3) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                     ,0xef,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: i == 1 || origin.Angle(loop[i]) < kMaxLength ",
                     0x3b);
          if (bVar3) goto LAB_00204215;
        }
        pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
        if ((local_d8.c_[0] == pVVar4->c_[0]) && (!NAN(local_d8.c_[0]) && !NAN(pVVar4->c_[0]))) {
          lVar7 = 0;
          do {
            if (lVar7 == 0x10) {
              bVar3 = false;
              goto LAB_00203d40;
            }
            dVar9 = *(double *)((long)local_d8.c_ + lVar7 + 8);
            pdVar1 = (double *)((long)pVVar4->c_ + lVar7 + 8);
            lVar7 = lVar7 + 8;
          } while ((dVar9 == *pdVar1) && (!NAN(dVar9) && !NAN(*pdVar1)));
        }
        pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
        bVar3 = 1e-15 <= ABS(local_d8.c_[2] * pVVar4->c_[2] +
                             local_d8.c_[1] * pVVar4->c_[1] + local_d8.c_[0] * pVVar4->c_[0] + 0.0);
LAB_00203d40:
        if (bVar3) {
          S2LogMessage::S2LogMessage
                    (&local_50,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                     ,0xf0,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_50.stream_,
                     "Check failed: origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15 "
                     ,0x4e);
          if (bVar3) {
LAB_00204215:
            local_b8->c_[1] = local_f0;
            local_b8->c_[2] = local_e8;
            local_b8->c_[0] = local_e0;
            abort();
          }
        }
        pVVar4 = S2PointLoopSpan::operator[](&local_98,(int)pVVar8);
        FVar2 = Vector3<double>::Angle(pVVar4,&local_d8);
        local_58 = pVVar8;
        if (3.141582653589793 < FVar2) {
          local_78 = local_d8.c_[2];
          local_88 = local_d8.c_[0];
          VStack_80 = local_d8.c_[1];
          pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
          local_64 = i;
          if ((local_d8.c_[0] == pVVar4->c_[0]) && (!NAN(local_d8.c_[0]) && !NAN(pVVar4->c_[0]))) {
            lVar7 = 8;
            do {
              if (lVar7 == 0x18) {
                pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
                pVVar5 = S2PointLoopSpan::operator[](&local_98,i);
                RobustCrossProd(&local_b0,pVVar4,pVVar5);
                dVar9 = local_b0.c_[2] * local_b0.c_[2] +
                        local_b0.c_[1] * local_b0.c_[1] + local_b0.c_[0] * local_b0.c_[0];
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                dVar9 = (double)(~-(ulong)(dVar9 != 0.0) & (ulong)dVar9 |
                                (ulong)(1.0 / dVar9) & -(ulong)(dVar9 != 0.0));
                local_d8.c_[0] = local_b0.c_[0] * dVar9;
                local_d8.c_[1] = local_b0.c_[1] * dVar9;
                local_d8.c_[2] = dVar9 * local_b0.c_[2];
                pcVar6 = local_70;
                goto LAB_00203fe7;
              }
              dVar9 = *(double *)((long)local_d8.c_ + lVar7);
              pdVar1 = (double *)((long)pVVar4->c_ + lVar7);
              lVar7 = lVar7 + 8;
            } while ((dVar9 == *pdVar1) && (!NAN(dVar9) && !NAN(*pdVar1)));
          }
          pVVar4 = S2PointLoopSpan::operator[](&local_98,i);
          pVVar5 = S2PointLoopSpan::operator[](&local_98,0);
          local_60 = Vector3<double>::Angle(pVVar4,pVVar5);
          pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
          if (3.141582653589793 <= local_60) {
            local_d8.c_[0] = pVVar4->c_[1] * local_78 - pVVar4->c_[2] * VStack_80;
            local_d8.c_[1] = pVVar4->c_[2] * local_88 - local_78 * pVVar4->c_[0];
            local_d8.c_[2] = VStack_80 * pVVar4->c_[0] - pVVar4->c_[1] * local_88;
            pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
            pcVar6 = local_70;
            (*local_70)(&local_b0,pVVar4,&local_88,&local_d8);
            local_e0 = local_e0 + local_b0.c_[0];
            local_f0 = local_f0 + local_b0.c_[1];
            local_e8 = local_e8 + local_b0.c_[2];
          }
          else {
            local_d8.c_[2] = pVVar4->c_[2];
            local_d8.c_[0] = pVVar4->c_[0];
            local_d8.c_[1] = pVVar4->c_[1];
            pcVar6 = local_70;
          }
LAB_00203fe7:
          i = local_64;
          pVVar4 = S2PointLoopSpan::operator[](&local_98,local_64);
          (*pcVar6)(&local_b0,&local_88,pVVar4,&local_d8);
          local_e0 = local_e0 + local_b0.c_[0];
          local_f0 = local_f0 + local_b0.c_[1];
          local_e8 = local_e8 + local_b0.c_[2];
        }
        pVVar4 = S2PointLoopSpan::operator[](&local_98,i);
        pVVar8 = local_58;
        i = (int)local_58;
        S2PointLoopSpan::operator[](&local_98,i);
        (*pcVar6)(&local_88,&local_d8,pVVar4);
        local_e0 = local_e0 + local_88;
        local_f0 = local_f0 + VStack_80;
        local_e8 = local_e8 + local_78;
        pVVar8 = (pointer)((long)pVVar8->c_ + 1);
      } while (pVVar8 < local_98.super_S2PointSpan.len_);
      local_b8->c_[1] = local_f0;
      local_b8->c_[2] = local_e8;
      __return_storage_ptr__ = local_b8;
    }
    __return_storage_ptr__->c_[0] = local_e0;
    pVVar4 = S2PointLoopSpan::operator[](&local_98,0);
    if ((local_d8.c_[0] == pVVar4->c_[0]) && (!NAN(local_d8.c_[0]) && !NAN(pVVar4->c_[0]))) {
      lVar7 = 0;
      do {
        if (lVar7 == 0x10) {
          return __return_storage_ptr__;
        }
        dVar9 = *(double *)((long)local_d8.c_ + lVar7 + 8);
        pdVar1 = (double *)((long)pVVar4->c_ + lVar7 + 8);
        lVar7 = lVar7 + 8;
      } while ((dVar9 == *pdVar1) && (!NAN(dVar9) && !NAN(*pdVar1)));
    }
    pVVar4 = S2PointLoopSpan::operator[](&local_98,(int)local_98.super_S2PointSpan.len_ + -1);
    pVVar5 = S2PointLoopSpan::operator[](&local_98,0);
    (*pcVar6)(&local_88,&local_d8,pVVar4,pVVar5);
    __return_storage_ptr__->c_[0] = local_88 + __return_storage_ptr__->c_[0];
    __return_storage_ptr__->c_[1] = VStack_80 + __return_storage_ptr__->c_[1];
    __return_storage_ptr__->c_[2] = local_78 + __return_storage_ptr__->c_[2];
  }
  return __return_storage_ptr__;
}

Assistant:

T GetSurfaceIntegral(S2PointLoopSpan loop,
                     T f_tri(const S2Point&, const S2Point&, const S2Point&)) {
  // We sum "f_tri" over a collection T of oriented triangles, possibly
  // overlapping.  Let the sign of a triangle be +1 if it is CCW and -1
  // otherwise, and let the sign of a point "x" be the sum of the signs of the
  // triangles containing "x".  Then the collection of triangles T is chosen
  // such that either:
  //
  //  (1) Each point in the loop interior has sign +1, and sign 0 otherwise; or
  //  (2) Each point in the loop exterior has sign -1, and sign 0 otherwise.
  //
  // The triangles basically consist of a "fan" from vertex 0 to every loop
  // edge that does not include vertex 0.  These triangles will always satisfy
  // either (1) or (2).  However, what makes this a bit tricky is that
  // spherical edges become numerically unstable as their length approaches
  // 180 degrees.  Of course there is not much we can do if the loop itself
  // contains such edges, but we would like to make sure that all the triangle
  // edges under our control (i.e., the non-loop edges) are stable.  For
  // example, consider a loop around the equator consisting of four equally
  // spaced points.  This is a well-defined loop, but we cannot just split it
  // into two triangles by connecting vertex 0 to vertex 2.
  //
  // We handle this type of situation by moving the origin of the triangle fan
  // whenever we are about to create an unstable edge.  We choose a new
  // location for the origin such that all relevant edges are stable.  We also
  // create extra triangles with the appropriate orientation so that the sum
  // of the triangle signs is still correct at every point.

  // The maximum length of an edge for it to be considered numerically stable.
  // The exact value is fairly arbitrary since it depends on the stability of
  // the "f_tri" function.  The value below is quite conservative but could be
  // reduced further if desired.
  static const double kMaxLength = M_PI - 1e-5;

  // The default constructor for T must initialize the value to zero.
  // (This is true for built-in types such as "double".)
  T sum = T();
  if (loop.size() < 3) return sum;

  S2Point origin = loop[0];
  for (int i = 1; i + 1 < loop.size(); ++i) {
    // Let V_i be loop[i], let O be the current origin, and let length(A,B)
    // be the length of edge (A,B).  At the start of each loop iteration, the
    // "leading edge" of the triangle fan is (O,V_i), and we want to extend
    // the triangle fan so that the leading edge is (O,V_i+1).
    //
    // Invariants:
    //  1. length(O,V_i) < kMaxLength for all (i > 1).
    //  2. Either O == V_0, or O is approximately perpendicular to V_0.
    //  3. "sum" is the oriented integral of f over the area defined by
    //     (O, V_0, V_1, ..., V_i).
    S2_DCHECK(i == 1 || origin.Angle(loop[i]) < kMaxLength);
    S2_DCHECK(origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15);

    if (loop[i + 1].Angle(origin) > kMaxLength) {
      // We are about to create an unstable edge, so choose a new origin O'
      // for the triangle fan.
      S2Point old_origin = origin;
      if (origin == loop[0]) {
        // The following point is well-separated from V_i and V_0 (and
        // therefore V_i+1 as well).
        origin = S2::RobustCrossProd(loop[0], loop[i]).Normalize();
      } else if (loop[i].Angle(loop[0]) < kMaxLength) {
        // All edges of the triangle (O, V_0, V_i) are stable, so we can
        // revert to using V_0 as the origin.
        origin = loop[0];
      } else {
        // (O, V_i+1) and (V_0, V_i) are antipodal pairs, and O and V_0 are
        // perpendicular.  Therefore V_0.CrossProd(O) is approximately
        // perpendicular to all of {O, V_0, V_i, V_i+1}, and we can choose
        // this point O' as the new origin.
        origin = loop[0].CrossProd(old_origin);

        // Advance the edge (V_0,O) to (V_0,O').
        sum += f_tri(loop[0], old_origin, origin);
      }
      // Advance the edge (O,V_i) to (O',V_i).
      sum += f_tri(old_origin, loop[i], origin);
    }
    // Advance the edge (O,V_i) to (O,V_i+1).
    sum += f_tri(origin, loop[i], loop[i+1]);
  }
  // If the origin is not V_0, we need to sum one more triangle.
  if (origin != loop[0]) {
    // Advance the edge (O,V_n-1) to (O,V_0).
    sum += f_tri(origin, loop[loop.size() - 1], loop[0]);
  }
  return sum;
}